

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O1

uint64_t __thiscall
poplar::
compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::get_dsp_(compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,uint64_t slot_id)

{
  pointer puVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  
  puVar1 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (this->table_).width_;
  uVar6 = uVar5 * slot_id;
  uVar7 = (ulong)((uint)uVar6 & 0x3f);
  uVar2 = puVar1[uVar6 >> 6];
  if (uVar5 + uVar7 < 0x41) {
    uVar4 = (uint)(uVar2 >> uVar7);
  }
  else {
    bVar3 = (byte)uVar6 & 0x3f;
    uVar4 = (uint)(uVar2 >> bVar3) | (uint)(puVar1[(uVar6 >> 6) + 1] << 0x40 - bVar3);
  }
  uVar4 = uVar4 & (uint)(this->table_).mask_ & 0x1f;
  uVar5 = (uint64_t)uVar4;
  if (uVar4 == 0x1f) {
    uVar5 = compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::get
                      (&this->aux_cht_,slot_id);
    if (uVar5 == 0xffffffffffffffff) {
      uVar5 = standard_hash_table<80U,_poplar::hash::vigna_hasher>::get(&this->aux_map_,slot_id);
      return uVar5;
    }
    uVar5 = uVar5 + 0x1f;
  }
  return uVar5;
}

Assistant:

uint64_t get_dsp_(uint64_t slot_id) const {
        uint64_t dsp = table_[slot_id] & dsp1_mask;
        if (dsp < dsp1_mask) {
            return dsp;
        }

        dsp = aux_cht_.get(slot_id);
        if (dsp != aux_cht_type::nil) {
            return dsp + dsp1_mask;
        }

        return aux_map_.get(slot_id);
    }